

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmap.h
# Opt level: O3

QByteArray * __thiscall QMap<int,_QByteArray>::operator[](QMap<int,_QByteArray> *this,int *key)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  QMapData<std::map<int,_QByteArray,_std::less<int>,_std::allocator<std::pair<const_int,_QByteArray>_>_>_>
  *pQVar3;
  _Rb_tree_iterator<std::pair<const_int,_QByteArray>_> _Var4;
  _Base_ptr p_Var5;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_iterator<std::pair<const_int,_QByteArray>_>,_bool> pVar6;
  pair<const_int,_QByteArray> local_40;
  QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QByteArray,_std::less<int>,_std::allocator<std::pair<const_int,_QByteArray>_>_>_>_>
  local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_20.d.ptr =
       (totally_ordered_wrapper<QMapData<std::map<int,_QByteArray,_std::less<int>,_std::allocator<std::pair<const_int,_QByteArray>_>_>_>_*>
        )(this->d).d.ptr;
  if ((local_20.d.ptr ==
       (QMapData<std::map<int,_QByteArray,_std::less<int>,_std::allocator<std::pair<const_int,_QByteArray>_>_>_>
        *)0x0) ||
     ((__atomic_base<int>)
      *(__int_type_conflict *)
       &(((QMapData<std::map<int,_QByteArray,_std::less<int>,_std::allocator<std::pair<const_int,_QByteArray>_>_>_>
           *)local_20.d.ptr)->super_QSharedData).ref.super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value == (__atomic_base<int>)0x1)) {
    local_20.d.ptr =
         (totally_ordered_wrapper<QMapData<std::map<int,_QByteArray,_std::less<int>,_std::allocator<std::pair<const_int,_QByteArray>_>_>_>_*>
          )(QMapData<std::map<int,_QByteArray,_std::less<int>,_std::allocator<std::pair<const_int,_QByteArray>_>_>_>
            *)0x0;
  }
  else {
    LOCK();
    (((QMapData<std::map<int,_QByteArray,_std::less<int>,_std::allocator<std::pair<const_int,_QByteArray>_>_>_>
       *)local_20.d.ptr)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value =
         (Type)((int)(((QMapData<std::map<int,_QByteArray,_std::less<int>,_std::allocator<std::pair<const_int,_QByteArray>_>_>_>
                        *)local_20.d.ptr)->super_QSharedData).ref.super_QAtomicInteger<int>.
                     super_QBasicAtomicInteger<int>._q_value + 1);
    UNLOCK();
  }
  detach(this);
  pQVar3 = (this->d).d.ptr;
  p_Var5 = *(_Base_ptr *)((long)&(pQVar3->m)._M_t._M_impl.super__Rb_tree_header._M_header + 8);
  iVar2 = *key;
  if (p_Var5 != (_Base_ptr)0x0) {
    p_Var1 = &(pQVar3->m)._M_t._M_impl.super__Rb_tree_header;
    _Var4._M_node = &p_Var1->_M_header;
    do {
      if (iVar2 <= (int)p_Var5[1]._M_color) {
        _Var4._M_node = p_Var5;
      }
      p_Var5 = (&p_Var5->_M_left)[(int)p_Var5[1]._M_color < iVar2];
    } while (p_Var5 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)_Var4._M_node != p_Var1) && ((int)_Var4._M_node[1]._M_color <= iVar2))
    goto LAB_00401da6;
  }
  local_40.second.d.d = (Data *)0x0;
  local_40.second.d.ptr = (char *)0x0;
  local_40.second.d.size = 0;
  local_40.first = iVar2;
  pVar6 = std::
          _Rb_tree<int,std::pair<int_const,QByteArray>,std::_Select1st<std::pair<int_const,QByteArray>>,std::less<int>,std::allocator<std::pair<int_const,QByteArray>>>
          ::_M_insert_unique<std::pair<int_const,QByteArray>>
                    ((_Rb_tree<int,std::pair<int_const,QByteArray>,std::_Select1st<std::pair<int_const,QByteArray>>,std::less<int>,std::allocator<std::pair<int_const,QByteArray>>>
                      *)&pQVar3->m,&local_40);
  _Var4 = pVar6.first._M_node;
  if (&(local_40.second.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_40.second.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_40.second.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_40.second.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
    {
      QArrayData::deallocate(&(local_40.second.d.d)->super_QArrayData,1,0x10);
    }
  }
LAB_00401da6:
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QByteArray,_std::less<int>,_std::allocator<std::pair<const_int,_QByteArray>_>_>_>_>
  ::~QExplicitlySharedDataPointerV2(&local_20);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return (QByteArray *)&_Var4._M_node[1]._M_parent;
  }
  __stack_chk_fail();
}

Assistant:

T &operator[](const Key &key)
    {
        const auto copy = d.isShared() ? *this : QMap(); // keep `key` alive across the detach
        detach();
        auto i = d->m.find(key);
        if (i == d->m.end())
            i = d->m.insert({key, T()}).first;
        return i->second;
    }